

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

ArchType __thiscall llvm::Triple::getArchTypeForLLVMName(Triple *this,StringRef Name)

{
  ArchType AVar1;
  ArchType AVar2;
  bool bVar3;
  bool bVar4;
  StringRef ArchName;
  
  ArchName.Length = Name.Data;
  ArchName.Data = (char *)this;
  AVar1 = parseBPFArch(ArchName);
  if (ArchName.Length == (char *)0x7) {
    bVar3 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x34366863 &&
            *(int *)&(this->Data)._M_dataplus._M_p == 0x63726161;
  }
  else {
    bVar3 = false;
  }
  AVar2 = aarch64;
  if (!bVar3) {
    if (ArchName.Length == (char *)0xa) {
      bVar4 = (short)(this->Data)._M_string_length == 0x6562 &&
              (this->Data)._M_dataplus._M_p == (pointer)0x5f34366863726161;
    }
    else {
      bVar4 = false;
    }
    AVar2 = bVar4 + aarch64;
    bVar3 = true;
    if (bVar4 == false) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x3) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'c' &&
              *(short *)&(this->Data)._M_dataplus._M_p == 0x7261;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = arc;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == '4' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x366d7261;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = aarch64;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x3) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'm' &&
              *(short *)&(this->Data)._M_dataplus._M_p == 0x7261;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = arm;
    }
    bVar3 = false;
    if (bVar4) {
      bVar3 = true;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'b' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x656d7261;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = armeb;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x3) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'r' &&
              *(short *)&(this->Data)._M_dataplus._M_p == 0x7661;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = avr;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length < (char *)0x3) {
      bVar4 = false;
    }
    else {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'f' &&
              *(short *)&(this->Data)._M_dataplus._M_p == 0x7062;
    }
    if (bVar4) {
      AVar2 = AVar1;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x4) {
      bVar4 = *(int *)&(this->Data)._M_dataplus._M_p == 0x7370696d;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = mips;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x6) {
      bVar4 = *(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x6c65 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x7370696d;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = mipsel;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x6) {
      bVar4 = *(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x3436 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x7370696d;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = mips64;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x8) {
      bVar4 = (this->Data)._M_dataplus._M_p == (pointer)0x6c6534367370696d;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = mips64el;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x6) {
      bVar4 = *(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x3033 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x3470736d;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = msp430;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == '2' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x736f696e;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = nios2;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == '4' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x36637070;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = ppc64;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == '2' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x33637070;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = ppc;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x3) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'c' &&
              *(short *)&(this->Data)._M_dataplus._M_p == 0x7070;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = ppc;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x7) {
      bVar4 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x656c3436 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x36637070;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = ppc64le;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x4) {
      bVar4 = *(int *)&(this->Data)._M_dataplus._M_p == 0x30303672;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = r600;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x6) {
      bVar4 = *(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x6e63 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x67646d61;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = amdgcn;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x7) {
      bVar4 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x32337663 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x63736972;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = riscv32;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x7) {
      bVar4 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x34367663 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x63736972;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = riscv64;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x7) {
      bVar4 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x6e6f6761 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x61786568;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = hexagon;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'c' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x72617073;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = sparc;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x7) {
      bVar4 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x6c656372 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x72617073;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = sparcel;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x7) {
      bVar4 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x39766372 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x72617073;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = sparcv9;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x7) {
      bVar4 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x7a6d6574 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x74737973;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = systemz;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x3) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'e' &&
              *(short *)&(this->Data)._M_dataplus._M_p == 0x6374;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = tce;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'e' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x6c656374;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = tcele;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'b' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x6d756874;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = thumb;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x7) {
      bVar4 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x6265626d &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x6d756874;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = thumbeb;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x3) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == '6' &&
              *(short *)&(this->Data)._M_dataplus._M_p == 0x3878;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = x86;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x6) {
      bVar4 = *(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x3436 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x2d363878;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = x86_64;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'e' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x726f6378;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = xcore;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'x' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x7470766e;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = nvptx;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x7) {
      bVar4 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x34367874 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x7470766e;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = nvptx64;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x4) {
      bVar4 = *(int *)&(this->Data)._M_dataplus._M_p == 0x3233656c;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = le32;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x4) {
      bVar4 = *(int *)&(this->Data)._M_dataplus._M_p == 0x3436656c;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = le64;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'l' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x69646d61;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = amdil;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x7) {
      bVar4 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x34366c69 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x69646d61;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = amdil64;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'l' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x69617368;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = hsail;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x7) {
      bVar4 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x34366c69 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x69617368;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = hsail64;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x4) {
      bVar4 = *(int *)&(this->Data)._M_dataplus._M_p == 0x72697073;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = spir;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x6) {
      bVar4 = *(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x3436 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x72697073;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = spir64;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x7) {
      bVar4 = *(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x61626d69 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x696c616b;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = kalimba;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'i' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x616e616c;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = lanai;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x5) {
      bVar4 = *(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'e' &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x76616873;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = shave;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x6) {
      bVar4 = *(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x3233 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x6d736177;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = wasm32;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0x6) {
      bVar4 = *(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x3436 &&
              *(int *)&(this->Data)._M_dataplus._M_p == 0x6d736177;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = wasm64;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0xe) {
      bVar4 = *(long *)((long)&(this->Data)._M_dataplus._M_p + 6) == 0x3233747069726373 &&
              (this->Data)._M_dataplus._M_p == (pointer)0x63737265646e6572;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = renderscript32;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  if (!bVar3) {
    if (ArchName.Length == (char *)0xe) {
      bVar4 = *(long *)((long)&(this->Data)._M_dataplus._M_p + 6) == 0x3436747069726373 &&
              (this->Data)._M_dataplus._M_p == (pointer)0x63737265646e6572;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      AVar2 = LastArchType;
    }
    bVar3 = true;
    if (!bVar4) {
      bVar3 = false;
    }
  }
  AVar1 = UnknownArch;
  if (bVar3) {
    AVar1 = AVar2;
  }
  return AVar1;
}

Assistant:

Triple::ArchType Triple::getArchTypeForLLVMName(StringRef Name) {
  Triple::ArchType BPFArch(parseBPFArch(Name));
  return StringSwitch<Triple::ArchType>(Name)
    .Case("aarch64", aarch64)
    .Case("aarch64_be", aarch64_be)
    .Case("arc", arc)
    .Case("arm64", aarch64) // "arm64" is an alias for "aarch64"
    .Case("arm", arm)
    .Case("armeb", armeb)
    .Case("avr", avr)
    .StartsWith("bpf", BPFArch)
    .Case("mips", mips)
    .Case("mipsel", mipsel)
    .Case("mips64", mips64)
    .Case("mips64el", mips64el)
    .Case("msp430", msp430)
    .Case("nios2", nios2)
    .Case("ppc64", ppc64)
    .Case("ppc32", ppc)
    .Case("ppc", ppc)
    .Case("ppc64le", ppc64le)
    .Case("r600", r600)
    .Case("amdgcn", amdgcn)
    .Case("riscv32", riscv32)
    .Case("riscv64", riscv64)
    .Case("hexagon", hexagon)
    .Case("sparc", sparc)
    .Case("sparcel", sparcel)
    .Case("sparcv9", sparcv9)
    .Case("systemz", systemz)
    .Case("tce", tce)
    .Case("tcele", tcele)
    .Case("thumb", thumb)
    .Case("thumbeb", thumbeb)
    .Case("x86", x86)
    .Case("x86-64", x86_64)
    .Case("xcore", xcore)
    .Case("nvptx", nvptx)
    .Case("nvptx64", nvptx64)
    .Case("le32", le32)
    .Case("le64", le64)
    .Case("amdil", amdil)
    .Case("amdil64", amdil64)
    .Case("hsail", hsail)
    .Case("hsail64", hsail64)
    .Case("spir", spir)
    .Case("spir64", spir64)
    .Case("kalimba", kalimba)
    .Case("lanai", lanai)
    .Case("shave", shave)
    .Case("wasm32", wasm32)
    .Case("wasm64", wasm64)
    .Case("renderscript32", renderscript32)
    .Case("renderscript64", renderscript64)
    .Default(UnknownArch);
}